

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::calculate
          (FunctionalTest7_8 *this,GLuint function,vec4<float> *left,vec4<float> *right,
          vec4<float> *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (function == 0) {
    fVar1 = left->m_x + right->m_x;
    fVar2 = left->m_y + right->m_y;
    fVar3 = left->m_z + right->m_z;
    fVar4 = left->m_w + right->m_w;
  }
  else {
    fVar1 = left->m_x * right->m_x;
    fVar2 = left->m_y * right->m_y;
    fVar3 = left->m_z * right->m_z;
    fVar4 = left->m_w * right->m_w;
  }
  out->m_x = fVar1;
  out->m_y = fVar2;
  out->m_z = fVar3;
  out->m_w = fVar4;
  return;
}

Assistant:

void FunctionalTest7_8::calculate(glw::GLuint function, const Utils::vec4<glw::GLfloat>& left,
								  const Utils::vec4<glw::GLfloat>& right, Utils::vec4<glw::GLfloat>& out) const
{
	if (0 == function)
	{
		out.m_x = left.m_x + right.m_x;
		out.m_y = left.m_y + right.m_y;
		out.m_z = left.m_z + right.m_z;
		out.m_w = left.m_w + right.m_w;
	}
	else
	{
		out.m_x = left.m_x * right.m_x;
		out.m_y = left.m_y * right.m_y;
		out.m_z = left.m_z * right.m_z;
		out.m_w = left.m_w * right.m_w;
	}
}